

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

void __thiscall
cmELFInternalImpl<cmELFTypes64>::PrintInfo(cmELFInternalImpl<cmELFTypes64> *this,ostream *os)

{
  ByteOrderType BVar1;
  long lVar2;
  char *pcVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"ELF ",4);
  std::__ostream_insert<char,std::char_traits<char>>(os,"64-bit",6);
  BVar1 = (this->super_cmELFInternal).ByteOrder;
  if (BVar1 == ByteOrderMSB) {
    pcVar3 = " MSB";
LAB_0013b52f:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,4);
  }
  else if (BVar1 == ByteOrderLSB) {
    pcVar3 = " LSB";
    goto LAB_0013b52f;
  }
  switch((this->super_cmELFInternal).ELFType) {
  case FileTypeInvalid:
    pcVar3 = " invalid file";
    lVar2 = 0xd;
    break;
  case FileTypeRelocatableObject:
    pcVar3 = " relocatable object";
    lVar2 = 0x13;
    break;
  case FileTypeExecutable:
    pcVar3 = " executable";
    lVar2 = 0xb;
    break;
  case FileTypeSharedLibrary:
    pcVar3 = " shared library";
    lVar2 = 0xf;
    break;
  case FileTypeCore:
    pcVar3 = " core file";
    lVar2 = 10;
    break;
  case FileTypeSpecificOS:
    pcVar3 = " os-specific type";
    lVar2 = 0x11;
    break;
  case FileTypeSpecificProc:
    pcVar3 = " processor-specific type";
    lVar2 = 0x18;
    break;
  default:
    goto switchD_0013b554_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
switchD_0013b554_default:
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

virtual void PrintInfo(std::ostream& os) const
    {
    os << "ELF " << Types::GetName();
    if(this->ByteOrder == ByteOrderMSB)
      {
      os << " MSB";
      }
    else if(this->ByteOrder == ByteOrderLSB)
      {
      os << " LSB";
      }
    switch(this->ELFType)
      {
      case cmELF::FileTypeInvalid:
        os << " invalid file";
        break;
      case cmELF::FileTypeRelocatableObject:
        os << " relocatable object";
        break;
      case cmELF::FileTypeExecutable:
        os << " executable";
        break;
      case cmELF::FileTypeSharedLibrary:
        os << " shared library";
        break;
      case cmELF::FileTypeCore:
        os << " core file";
        break;
      case cmELF::FileTypeSpecificOS:
        os << " os-specific type";
        break;
      case cmELF::FileTypeSpecificProc:
        os << " processor-specific type";
        break;
      }
    os << "\n";
    }